

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O1

void __thiscall
glslang::TIntermediate::finalCheck(TIntermediate *this,TInfoSink *infoSink,bool keepUncalled)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  const_iterator cVar2;
  pointer pTVar3;
  TInfoSinkBase *pTVar4;
  uint uVar5;
  int iVar6;
  char *pcVar7;
  long lVar8;
  uint n;
  ulong uVar9;
  bool bVar10;
  TFinalLinkTraverser finalLinkTraverser;
  key_type local_1f8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  key_type local_1c0;
  key_type local_198;
  key_type local_170;
  key_type local_148;
  key_type local_120;
  key_type local_f8;
  key_type local_d0;
  key_type local_a8;
  key_type local_80;
  key_type local_58;
  
  if (this->treeRoot == (TIntermNode *)0x0) {
    return;
  }
  if (this->numEntryPoints < 1) {
    if (this->source == EShSourceGlsl) {
      error(this,infoSink,"Missing entry point: Each stage requires one entry point",EShLangCount);
    }
    else {
      warn(this,infoSink,"Entry point not found",EShLangCount);
    }
  }
  checkCallGraphCycles(this,infoSink);
  checkCallGraphBodies(this,infoSink,keepUncalled);
  inOutLocationCheck(this,infoSink);
  if (1 < this->numPushConstants) {
    error(this,infoSink,"Only one push_constant block is allowed per stage",EShLangCount);
  }
  if (this->invocations == -1) {
    this->invocations = 1;
  }
  local_1f8._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
  local_1f8._M_dataplus._M_p._0_1_ = SUB81(&local_1f8.field_2,0);
  local_1f8._M_dataplus._M_p._1_7_ = (undefined7)((ulong)&local_1f8.field_2 >> 8);
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  _M_construct<char_const*>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_1f8,
             "gl_ClipDistance","");
  this_00 = &this->ioAccessed;
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
          ::find(&this_00->_M_t,&local_1f8);
  p_Var1 = &(this->ioAccessed)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar2._M_node == p_Var1) {
    bVar10 = false;
  }
  else {
    local_58._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char_const*>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_58,
               "gl_ClipVertex","");
    cVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
            ::find(&this_00->_M_t,&local_58);
    bVar10 = (_Rb_tree_header *)cVar2._M_node != p_Var1;
  }
  if (bVar10) {
    error(this,infoSink,
          "Can only use one of gl_ClipDistance or gl_ClipVertex (gl_ClipDistance is preferred)",
          EShLangCount);
  }
  local_1f8._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
  local_1f8._M_dataplus._M_p._0_1_ = SUB81(&local_1f8.field_2,0);
  local_1f8._M_dataplus._M_p._1_7_ = (undefined7)((ulong)&local_1f8.field_2 >> 8);
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  _M_construct<char_const*>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_1f8,
             "gl_CullDistance","");
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
          ::find(&this_00->_M_t,&local_1f8);
  if ((_Rb_tree_header *)cVar2._M_node == p_Var1) {
    bVar10 = false;
  }
  else {
    local_80._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char_const*>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_80,
               "gl_ClipVertex","");
    cVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
            ::find(&this_00->_M_t,&local_80);
    bVar10 = (_Rb_tree_header *)cVar2._M_node != p_Var1;
  }
  if (bVar10) {
    error(this,infoSink,
          "Can only use one of gl_CullDistance or gl_ClipVertex (gl_ClipDistance is preferred)",
          EShLangCount);
  }
  bVar10 = userOutputUsed(this);
  if (bVar10) {
    local_a8._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char_const*>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_a8,
               "gl_FragColor","");
    cVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
            ::find(&this_00->_M_t,&local_a8);
    if ((_Rb_tree_header *)cVar2._M_node == p_Var1) {
      local_d0._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char_const*>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_d0,"gl_FragData","");
      cVar2 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
              ::find(&this_00->_M_t,&local_d0);
      bVar10 = (_Rb_tree_header *)cVar2._M_node != p_Var1;
    }
    else {
      bVar10 = true;
    }
  }
  else {
    bVar10 = false;
  }
  if (bVar10) {
    error(this,infoSink,"Cannot use gl_FragColor or gl_FragData when using user-defined outputs",
          EShLangCount);
  }
  local_1f8._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
  local_1f8._M_dataplus._M_p._0_1_ = SUB81(&local_1f8.field_2,0);
  local_1f8._M_dataplus._M_p._1_7_ = (undefined7)((ulong)&local_1f8.field_2 >> 8);
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  _M_construct<char_const*>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_1f8,
             "gl_FragColor","");
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
          ::find(&this_00->_M_t,&local_1f8);
  if ((_Rb_tree_header *)cVar2._M_node == p_Var1) {
    bVar10 = false;
  }
  else {
    local_f8._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char_const*>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_f8,
               "gl_FragData","");
    cVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
            ::find(&this_00->_M_t,&local_f8);
    bVar10 = (_Rb_tree_header *)cVar2._M_node != p_Var1;
  }
  if (bVar10) {
    error(this,infoSink,"Cannot use both gl_FragColor and gl_FragData",EShLangCount);
  }
  pTVar3 = (this->xfbBuffers).
           super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->xfbBuffers).
      super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>._M_impl.
      super__Vector_impl_data._M_finish != pTVar3) {
    lVar8 = 0;
    uVar9 = 0;
    do {
      if ((&pTVar3->contains64BitType)[lVar8] == false) {
        if ((&pTVar3->contains32BitType)[lVar8] != false) {
          uVar5 = 0xfffffffc;
          iVar6 = 3;
          goto LAB_0036e8b8;
        }
        if ((&pTVar3->contains16BitType)[lVar8] == true) {
          uVar5 = 0xfffffffe;
          iVar6 = 1;
          goto LAB_0036e8b8;
        }
      }
      else {
        uVar5 = 0xfffffff8;
        iVar6 = 7;
LAB_0036e8b8:
        *(uint *)((long)&pTVar3->implicitStride + lVar8) =
             iVar6 + *(int *)((long)&pTVar3->implicitStride + lVar8) & uVar5;
      }
      uVar5 = *(uint *)((long)&pTVar3->stride + lVar8);
      n = (uint)uVar9;
      if ((uVar5 != 0x3fff) && (uVar5 < *(uint *)((long)&pTVar3->implicitStride + lVar8))) {
        error(this,infoSink,"xfb_stride is too small to hold all buffer entries:",EShLangCount);
        TInfoSinkBase::append(&infoSink->info,"ERROR: ");
        TInfoSinkBase::append(&infoSink->info,"    xfb_buffer ");
        pTVar4 = TInfoSinkBase::operator<<(&infoSink->info,n);
        TInfoSinkBase::append(pTVar4,", xfb_stride ");
        pTVar4 = TInfoSinkBase::operator<<
                           (pTVar4,*(uint *)((long)&((this->xfbBuffers).
                                                                                                          
                                                  super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->stride
                                            + lVar8));
        TInfoSinkBase::append(pTVar4,", minimum stride needed: ");
        pTVar4 = TInfoSinkBase::operator<<
                           (pTVar4,*(uint *)((long)&((this->xfbBuffers).
                                                                                                          
                                                  super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  implicitStride + lVar8));
        TInfoSinkBase::append(pTVar4,"\n");
      }
      pTVar3 = (this->xfbBuffers).
               super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>._M_impl
               .super__Vector_impl_data._M_start;
      if (*(int *)((long)&pTVar3->stride + lVar8) == 0x3fff) {
        *(undefined4 *)((long)&pTVar3->stride + lVar8) =
             *(undefined4 *)((long)&pTVar3->implicitStride + lVar8);
      }
      if (((((&pTVar3->contains64BitType)[lVar8] == true) &&
           (pcVar7 = 
            "xfb_stride must be multiple of 8 for buffer holding a double or 64-bit integer:",
           (*(byte *)((long)&pTVar3->stride + lVar8) & 7) != 0)) ||
          (((&pTVar3->contains32BitType)[lVar8] == true &&
           (pcVar7 = "xfb_stride must be multiple of 4:",
           (*(byte *)((long)&pTVar3->stride + lVar8) & 3) != 0)))) ||
         (((&pTVar3->contains16BitType)[lVar8] == true &&
          (pcVar7 = 
           "xfb_stride must be multiple of 2 for buffer holding a half float or 16-bit integer:",
          (*(byte *)((long)&pTVar3->stride + lVar8) & 1) != 0)))) {
        error(this,infoSink,pcVar7,EShLangCount);
        TInfoSinkBase::append(&infoSink->info,"ERROR: ");
        TInfoSinkBase::append(&infoSink->info,"    xfb_buffer ");
        pTVar4 = TInfoSinkBase::operator<<(&infoSink->info,n);
        TInfoSinkBase::append(pTVar4,", xfb_stride ");
        pTVar4 = TInfoSinkBase::operator<<
                           (pTVar4,*(uint *)((long)&((this->xfbBuffers).
                                                                                                          
                                                  super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->stride
                                            + lVar8));
        TInfoSinkBase::append(pTVar4,"\n");
      }
      if ((this->resources).isSet == false) {
LAB_0036f0c7:
        __assert_fail("isSet",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/localintermediate.h"
                      ,0x121,
                      "const T *glslang::MustBeAssigned<TBuiltInResource>::operator->() const [T = TBuiltInResource]"
                     );
      }
      if ((uint)((this->resources).value.maxTransformFeedbackInterleavedComponents << 2) <
          *(uint *)((long)&((this->xfbBuffers).
                            super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>
                            ._M_impl.super__Vector_impl_data._M_start)->stride + lVar8)) {
        error(this,infoSink,"xfb_stride is too large:",EShLangCount);
        TInfoSinkBase::append(&infoSink->info,"ERROR: ");
        TInfoSinkBase::append(&infoSink->info,"    xfb_buffer ");
        pTVar4 = TInfoSinkBase::operator<<(&infoSink->info,n);
        TInfoSinkBase::append(pTVar4,", components (1/4 stride) needed are ");
        pTVar4 = TInfoSinkBase::operator<<
                           (pTVar4,*(uint *)((long)&((this->xfbBuffers).
                                                                                                          
                                                  super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->stride
                                            + lVar8) >> 2);
        TInfoSinkBase::append(pTVar4,", gl_MaxTransformFeedbackInterleavedComponents is ");
        if ((this->resources).isSet == false) goto LAB_0036f0c7;
        pTVar4 = TInfoSinkBase::operator<<
                           (pTVar4,(this->resources).value.maxTransformFeedbackInterleavedComponents
                           );
        TInfoSinkBase::append(pTVar4,"\n");
      }
      uVar9 = uVar9 + 1;
      pTVar3 = (this->xfbBuffers).
               super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>._M_impl
               .super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x28;
    } while (uVar9 < (ulong)(((long)(this->xfbBuffers).
                                    super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar3 >> 3)
                            * -0x3333333333333333));
  }
  switch(this->language) {
  case EShLangVertex:
    goto switchD_0036eb46_caseD_0;
  case EShLangTessControl:
    if (this->vertices != -1) goto switchD_0036eb46_caseD_0;
    pcVar7 = "At least one shader must specify an output layout(vertices=...)";
    break;
  case EShLangTessEvaluation:
    if (this->source == EShSourceGlsl) {
      if (this->inputPrimitive == ElgNone) {
        error(this,infoSink,"At least one shader must specify an input layout primitive",
              EShLangCount);
      }
      if (this->vertexSpacing == EvsNone) {
        this->vertexSpacing = EvsEqual;
      }
      if (this->vertexOrder == EvoNone) {
        this->vertexOrder = EvoCcw;
      }
    }
    goto switchD_0036eb46_caseD_0;
  case EShLangGeometry:
    if (this->inputPrimitive == ElgNone) {
      error(this,infoSink,"At least one shader must specify an input layout primitive",EShLangCount)
      ;
    }
    if (this->outputPrimitive == ElgNone) {
      error(this,infoSink,"At least one shader must specify an output layout primitive",EShLangCount
           );
    }
    if (this->vertices != -1) goto switchD_0036eb46_caseD_0;
    pcVar7 = "At least one shader must specify a layout(max_vertices = value)";
    break;
  case EShLangFragment:
    if ((this->postDepthCoverage != true) || (this->earlyFragmentTests != false))
    goto switchD_0036eb46_caseD_0;
    pcVar7 = "post_depth_coverage requires early_fragment_tests";
    break;
  case EShLangCompute:
    goto switchD_0036eb46_caseD_5;
  case EShLangRayGen:
  case EShLangIntersect:
  case EShLangAnyHit:
  case EShLangClosestHit:
  case EShLangMiss:
  case EShLangCallable:
    if (this->numShaderRecordBlocks < 2) goto switchD_0036eb46_caseD_0;
    pcVar7 = "Only one shaderRecordNV buffer block is allowed per stage";
    break;
  case EShLangMesh:
    local_1f8._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
    local_1f8._M_dataplus._M_p._0_1_ = SUB81(&local_1f8.field_2,0);
    local_1f8._M_dataplus._M_p._1_7_ = (undefined7)((ulong)&local_1f8.field_2 >> 8);
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char_const*>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_1f8
               ,"gl_Position","");
    cVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
            ::find(&this_00->_M_t,&local_1f8);
    if ((_Rb_tree_header *)cVar2._M_node == p_Var1) {
      bVar10 = false;
    }
    else {
      local_120._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char_const*>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_120,"gl_PositionPerViewNV","");
      cVar2 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
              ::find(&this_00->_M_t,&local_120);
      bVar10 = (_Rb_tree_header *)cVar2._M_node != p_Var1;
    }
    if (bVar10) {
      error(this,infoSink,"Can only use one of gl_Position or gl_PositionPerViewNV",EShLangCount);
    }
    local_1f8._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
    local_1f8._M_dataplus._M_p._0_1_ = SUB81(&local_1f8.field_2,0);
    local_1f8._M_dataplus._M_p._1_7_ = (undefined7)((ulong)&local_1f8.field_2 >> 8);
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char_const*>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_1f8
               ,"gl_ClipDistance","");
    cVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
            ::find(&this_00->_M_t,&local_1f8);
    if ((_Rb_tree_header *)cVar2._M_node == p_Var1) {
      bVar10 = false;
    }
    else {
      local_148._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char_const*>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_148,"gl_ClipDistancePerViewNV","");
      cVar2 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
              ::find(&this_00->_M_t,&local_148);
      bVar10 = (_Rb_tree_header *)cVar2._M_node != p_Var1;
    }
    if (bVar10) {
      error(this,infoSink,"Can only use one of gl_ClipDistance or gl_ClipDistancePerViewNV",
            EShLangCount);
    }
    local_1f8._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
    local_1f8._M_dataplus._M_p._0_1_ = SUB81(&local_1f8.field_2,0);
    local_1f8._M_dataplus._M_p._1_7_ = (undefined7)((ulong)&local_1f8.field_2 >> 8);
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char_const*>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_1f8
               ,"gl_CullDistance","");
    cVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
            ::find(&this_00->_M_t,&local_1f8);
    if ((_Rb_tree_header *)cVar2._M_node == p_Var1) {
      bVar10 = false;
    }
    else {
      local_170._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char_const*>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_170,"gl_CullDistancePerViewNV","");
      cVar2 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
              ::find(&this_00->_M_t,&local_170);
      bVar10 = (_Rb_tree_header *)cVar2._M_node != p_Var1;
    }
    if (bVar10) {
      error(this,infoSink,"Can only use one of gl_CullDistance or gl_CullDistancePerViewNV",
            EShLangCount);
    }
    local_1f8._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
    local_1f8._M_dataplus._M_p._0_1_ = SUB81(&local_1f8.field_2,0);
    local_1f8._M_dataplus._M_p._1_7_ = (undefined7)((ulong)&local_1f8.field_2 >> 8);
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char_const*>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_1f8
               ,"gl_Layer","");
    cVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
            ::find(&this_00->_M_t,&local_1f8);
    if ((_Rb_tree_header *)cVar2._M_node == p_Var1) {
      bVar10 = false;
    }
    else {
      local_198._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
      local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char_const*>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_198,"gl_LayerPerViewNV","");
      cVar2 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
              ::find(&this_00->_M_t,&local_198);
      bVar10 = (_Rb_tree_header *)cVar2._M_node != p_Var1;
    }
    if (bVar10) {
      error(this,infoSink,"Can only use one of gl_Layer or gl_LayerPerViewNV",EShLangCount);
    }
    local_1f8._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
    local_1f8._M_dataplus._M_p._0_1_ = SUB81(&local_1f8.field_2,0);
    local_1f8._M_dataplus._M_p._1_7_ = (undefined7)((ulong)&local_1f8.field_2 >> 8);
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char_const*>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_1f8
               ,"gl_ViewportMask","");
    cVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
            ::find(&this_00->_M_t,&local_1f8);
    if ((_Rb_tree_header *)cVar2._M_node == p_Var1) {
      bVar10 = false;
    }
    else {
      local_1c0._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
      local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char_const*>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_1c0,"gl_ViewportMaskPerViewNV","");
      cVar2 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
              ::find(&this_00->_M_t,&local_1c0);
      bVar10 = (_Rb_tree_header *)cVar2._M_node != p_Var1;
    }
    if (bVar10) {
      error(this,infoSink,"Can only use one of gl_ViewportMask or gl_ViewportMaskPerViewNV",
            EShLangCount);
    }
    if (this->outputPrimitive == ElgNone) {
      error(this,infoSink,"At least one shader must specify an output layout primitive",EShLangCount
           );
    }
    if (this->vertices == -1) {
      error(this,infoSink,"At least one shader must specify a layout(max_vertices = value)",
            EShLangCount);
    }
    if (this->primitives == -1) {
      error(this,infoSink,"At least one shader must specify a layout(max_primitives = value)",
            EShLangCount);
    }
  case EShLangTask:
    if (1 < this->numTaskNVBlocks) {
      error(this,infoSink,"Only one taskNV interface block is allowed per shader",EShLangCount);
    }
    if (1 < this->numTaskEXTPayloads) {
      error(this,infoSink,"Only single variable of type taskPayloadSharedEXT is allowed per shader",
            EShLangCount);
    }
    goto switchD_0036eb46_caseD_5;
  default:
    pcVar7 = "Unknown Stage.";
  }
  error(this,infoSink,pcVar7,EShLangCount);
switchD_0036eb46_caseD_0:
  local_1f8._M_dataplus.super_allocator_type.allocator =
       (TPoolAllocator *)&PTR__TIntermTraverser_0093ba08;
  local_1f8._M_dataplus._M_p._0_1_ = 1;
  local_1f8.field_2._M_allocated_capacity = 0;
  local_1f8.field_2._8_8_ = 0;
  local_1d0 = 0;
  uStack_1c8 = 0;
  local_1f8._M_dataplus._M_p._1_7_ = 0;
  local_1f8._M_string_length._0_4_ = 0;
  local_1f8.field_2._M_allocated_capacity = (size_type)GetThreadPoolAllocator();
  local_1f8.field_2._8_8_ = 0;
  local_1d0 = 0;
  uStack_1c8 = 0;
  local_1f8._M_dataplus.super_allocator_type.allocator =
       (TPoolAllocator *)&PTR__TIntermTraverser_0093bb40;
  (*this->treeRoot->_vptr_TIntermNode[2])(this->treeRoot,&local_1f8);
  return;
switchD_0036eb46_caseD_5:
  sharedBlockCheck(this,infoSink);
  goto switchD_0036eb46_caseD_0;
}

Assistant:

void TIntermediate::finalCheck(TInfoSink& infoSink, bool keepUncalled)
{
    if (getTreeRoot() == nullptr)
        return;

    if (numEntryPoints < 1) {
        if (getSource() == EShSourceGlsl)
            error(infoSink, "Missing entry point: Each stage requires one entry point");
        else
            warn(infoSink, "Entry point not found");
    }

    // recursion and missing body checking
    checkCallGraphCycles(infoSink);
    checkCallGraphBodies(infoSink, keepUncalled);

    // overlap/alias/missing I/O, etc.
    inOutLocationCheck(infoSink);

    if (getNumPushConstants() > 1)
        error(infoSink, "Only one push_constant block is allowed per stage");

    // invocations
    if (invocations == TQualifier::layoutNotSet)
        invocations = 1;

    if (inIoAccessed("gl_ClipDistance") && inIoAccessed("gl_ClipVertex"))
        error(infoSink, "Can only use one of gl_ClipDistance or gl_ClipVertex (gl_ClipDistance is preferred)");
    if (inIoAccessed("gl_CullDistance") && inIoAccessed("gl_ClipVertex"))
        error(infoSink, "Can only use one of gl_CullDistance or gl_ClipVertex (gl_ClipDistance is preferred)");

    if (userOutputUsed() && (inIoAccessed("gl_FragColor") || inIoAccessed("gl_FragData")))
        error(infoSink, "Cannot use gl_FragColor or gl_FragData when using user-defined outputs");
    if (inIoAccessed("gl_FragColor") && inIoAccessed("gl_FragData"))
        error(infoSink, "Cannot use both gl_FragColor and gl_FragData");

    for (size_t b = 0; b < xfbBuffers.size(); ++b) {
        if (xfbBuffers[b].contains64BitType)
            RoundToPow2(xfbBuffers[b].implicitStride, 8);
        else if (xfbBuffers[b].contains32BitType)
            RoundToPow2(xfbBuffers[b].implicitStride, 4);
        else if (xfbBuffers[b].contains16BitType)
            RoundToPow2(xfbBuffers[b].implicitStride, 2);

        // "It is a compile-time or link-time error to have
        // any xfb_offset that overflows xfb_stride, whether stated on declarations before or after the xfb_stride, or
        // in different compilation units. While xfb_stride can be declared multiple times for the same buffer, it is a
        // compile-time or link-time error to have different values specified for the stride for the same buffer."
        if (xfbBuffers[b].stride != TQualifier::layoutXfbStrideEnd && xfbBuffers[b].implicitStride > xfbBuffers[b].stride) {
            error(infoSink, "xfb_stride is too small to hold all buffer entries:");
            infoSink.info.prefix(EPrefixError);
            infoSink.info << "    xfb_buffer " << (unsigned int)b << ", xfb_stride " << xfbBuffers[b].stride << ", minimum stride needed: " << xfbBuffers[b].implicitStride << "\n";
        }
        if (xfbBuffers[b].stride == TQualifier::layoutXfbStrideEnd)
            xfbBuffers[b].stride = xfbBuffers[b].implicitStride;

        // "If the buffer is capturing any
        // outputs with double-precision or 64-bit integer components, the stride must be a multiple of 8, otherwise it must be a
        // multiple of 4, or a compile-time or link-time error results."
        if (xfbBuffers[b].contains64BitType && ! IsMultipleOfPow2(xfbBuffers[b].stride, 8)) {
            error(infoSink, "xfb_stride must be multiple of 8 for buffer holding a double or 64-bit integer:");
            infoSink.info.prefix(EPrefixError);
            infoSink.info << "    xfb_buffer " << (unsigned int)b << ", xfb_stride " << xfbBuffers[b].stride << "\n";
        } else if (xfbBuffers[b].contains32BitType && ! IsMultipleOfPow2(xfbBuffers[b].stride, 4)) {
            error(infoSink, "xfb_stride must be multiple of 4:");
            infoSink.info.prefix(EPrefixError);
            infoSink.info << "    xfb_buffer " << (unsigned int)b << ", xfb_stride " << xfbBuffers[b].stride << "\n";
        }
        // "If the buffer is capturing any
        // outputs with half-precision or 16-bit integer components, the stride must be a multiple of 2"
        else if (xfbBuffers[b].contains16BitType && ! IsMultipleOfPow2(xfbBuffers[b].stride, 2)) {
            error(infoSink, "xfb_stride must be multiple of 2 for buffer holding a half float or 16-bit integer:");
            infoSink.info.prefix(EPrefixError);
            infoSink.info << "    xfb_buffer " << (unsigned int)b << ", xfb_stride " << xfbBuffers[b].stride << "\n";
        }

        // "The resulting stride (implicit or explicit), when divided by 4, must be less than or equal to the
        // implementation-dependent constant gl_MaxTransformFeedbackInterleavedComponents."
        if (xfbBuffers[b].stride > (unsigned int)(4 * resources->maxTransformFeedbackInterleavedComponents)) {
            error(infoSink, "xfb_stride is too large:");
            infoSink.info.prefix(EPrefixError);
            infoSink.info << "    xfb_buffer " << (unsigned int)b << ", components (1/4 stride) needed are " << xfbBuffers[b].stride/4 << ", gl_MaxTransformFeedbackInterleavedComponents is " << resources->maxTransformFeedbackInterleavedComponents << "\n";
        }
    }

    switch (language) {
    case EShLangVertex:
        break;
    case EShLangTessControl:
        if (vertices == TQualifier::layoutNotSet)
            error(infoSink, "At least one shader must specify an output layout(vertices=...)");
        break;
    case EShLangTessEvaluation:
        if (getSource() == EShSourceGlsl) {
            if (inputPrimitive == ElgNone)
                error(infoSink, "At least one shader must specify an input layout primitive");
            if (vertexSpacing == EvsNone)
                vertexSpacing = EvsEqual;
            if (vertexOrder == EvoNone)
                vertexOrder = EvoCcw;
        }
        break;
    case EShLangGeometry:
        if (inputPrimitive == ElgNone)
            error(infoSink, "At least one shader must specify an input layout primitive");
        if (outputPrimitive == ElgNone)
            error(infoSink, "At least one shader must specify an output layout primitive");
        if (vertices == TQualifier::layoutNotSet)
            error(infoSink, "At least one shader must specify a layout(max_vertices = value)");
        break;
    case EShLangFragment:
        // for GL_ARB_post_depth_coverage, EarlyFragmentTest is set automatically in
        // ParseHelper.cpp. So if we reach here, this must be GL_EXT_post_depth_coverage
        // requiring explicit early_fragment_tests
        if (getPostDepthCoverage() && !getEarlyFragmentTests())
            error(infoSink, "post_depth_coverage requires early_fragment_tests");
        break;
    case EShLangCompute:
        sharedBlockCheck(infoSink);
        break;
    case EShLangRayGen:
    case EShLangIntersect:
    case EShLangAnyHit:
    case EShLangClosestHit:
    case EShLangMiss:
    case EShLangCallable:
        if (numShaderRecordBlocks > 1)
            error(infoSink, "Only one shaderRecordNV buffer block is allowed per stage");
        break;
    case EShLangMesh:
        // NV_mesh_shader doesn't allow use of both single-view and per-view builtins.
        if (inIoAccessed("gl_Position") && inIoAccessed("gl_PositionPerViewNV"))
            error(infoSink, "Can only use one of gl_Position or gl_PositionPerViewNV");
        if (inIoAccessed("gl_ClipDistance") && inIoAccessed("gl_ClipDistancePerViewNV"))
            error(infoSink, "Can only use one of gl_ClipDistance or gl_ClipDistancePerViewNV");
        if (inIoAccessed("gl_CullDistance") && inIoAccessed("gl_CullDistancePerViewNV"))
            error(infoSink, "Can only use one of gl_CullDistance or gl_CullDistancePerViewNV");
        if (inIoAccessed("gl_Layer") && inIoAccessed("gl_LayerPerViewNV"))
            error(infoSink, "Can only use one of gl_Layer or gl_LayerPerViewNV");
        if (inIoAccessed("gl_ViewportMask") && inIoAccessed("gl_ViewportMaskPerViewNV"))
            error(infoSink, "Can only use one of gl_ViewportMask or gl_ViewportMaskPerViewNV");
        if (outputPrimitive == ElgNone)
            error(infoSink, "At least one shader must specify an output layout primitive");
        if (vertices == TQualifier::layoutNotSet)
            error(infoSink, "At least one shader must specify a layout(max_vertices = value)");
        if (primitives == TQualifier::layoutNotSet)
            error(infoSink, "At least one shader must specify a layout(max_primitives = value)");
        [[fallthrough]];
    case EShLangTask:
        if (numTaskNVBlocks > 1)
            error(infoSink, "Only one taskNV interface block is allowed per shader");
        if (numTaskEXTPayloads > 1)
            error(infoSink, "Only single variable of type taskPayloadSharedEXT is allowed per shader");
        sharedBlockCheck(infoSink);
        break;
    default:
        error(infoSink, "Unknown Stage.");
        break;
    }

    // Process the tree for any node-specific work.
    class TFinalLinkTraverser : public TIntermTraverser {
    public:
        TFinalLinkTraverser() { }
        virtual ~TFinalLinkTraverser() { }

        virtual void visitSymbol(TIntermSymbol* symbol)
        {
            // Implicitly size arrays.
            // If an unsized array is left as unsized, it effectively
            // becomes run-time sized.
            symbol->getWritableType().adoptImplicitArraySizes(false);
        }
    } finalLinkTraverser;

    treeRoot->traverse(&finalLinkTraverser);
}